

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall t_rs_generator::render_type_comment(t_rs_generator *this,string *type_name)

{
  ostream *poVar1;
  string *type_name_local;
  t_rs_generator *this_local;
  
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"//");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"// ");
  poVar1 = std::operator<<(poVar1,(string *)type_name);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"//");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rs_generator::render_type_comment(const string& type_name) {
  f_gen_ << "//" << endl;
  f_gen_ << "// " << type_name << endl;
  f_gen_ << "//" << endl;
  f_gen_ << endl;
}